

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O2

string * flatbuffers::GenIncludeGuard
                   (string *__return_storage_ptr__,string *file_name,Namespace *name_space,
                   string *postfix)

{
  _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
  *p_Var1;
  pointer pbVar2;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar3;
  _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
  *p_Var4;
  string *component;
  _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
  *p_Var5;
  pointer __lhs;
  _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
  *p_Var6;
  long lVar7;
  size_type sVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)file_name);
  p_Var6 = (_Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
            *)(__return_storage_ptr__->_M_dataplus)._M_p;
  sVar8 = __return_storage_ptr__->_M_string_length;
  p_Var1 = p_Var6 + sVar8;
  for (lVar7 = (long)sVar8 >> 2; p_Var4 = p_Var6, p_Var5 = p_Var1, 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
            ::operator()(p_Var6,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )file_name);
    if (bVar3) goto LAB_0014e9c1;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
            ::operator()(p_Var6 + 1,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )file_name);
    p_Var4 = p_Var6 + 1;
    if (bVar3) goto LAB_0014e9c1;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
            ::operator()(p_Var6 + 2,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )file_name);
    p_Var4 = p_Var6 + 2;
    if (bVar3) goto LAB_0014e9c1;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
            ::operator()(p_Var6 + 3,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )file_name);
    p_Var4 = p_Var6 + 3;
    if (bVar3) goto LAB_0014e9c1;
    p_Var6 = p_Var6 + 4;
    sVar8 = sVar8 - 4;
  }
  if (sVar8 == 1) {
LAB_0014e9b0:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
            ::operator()(p_Var6,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )file_name);
    p_Var4 = p_Var6;
    if (!bVar3) {
      p_Var4 = p_Var1;
    }
  }
  else if (sVar8 == 2) {
LAB_0014e9a1:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
            ::operator()(p_Var6,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )file_name);
    p_Var4 = p_Var6;
    if (!bVar3) {
      p_Var6 = p_Var6 + 1;
      goto LAB_0014e9b0;
    }
  }
  else {
    if (sVar8 != 3) goto LAB_0014e9eb;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
            ::operator()(p_Var6,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 )file_name);
    if (!bVar3) {
      p_Var6 = p_Var6 + 1;
      goto LAB_0014e9a1;
    }
  }
LAB_0014e9c1:
  p_Var6 = p_Var4;
  if (p_Var4 != p_Var1) {
    while (p_Var5 = p_Var6, p_Var4 = p_Var4 + 1, p_Var4 != p_Var1) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<flatbuffers::GenIncludeGuard(std::__cxx11::string_const&,flatbuffers::Namespace_const&,std::__cxx11::string_const&)::IsAlnum>
              ::operator()(p_Var4,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   )file_name);
      p_Var6 = p_Var5;
      if (!bVar3) {
        *p_Var5 = *p_Var4;
        p_Var6 = p_Var5 + 1;
      }
    }
  }
LAB_0014e9eb:
  std::__cxx11::string::erase
            (__return_storage_ptr__,p_Var5,
             (__return_storage_ptr__->_M_dataplus)._M_p + __return_storage_ptr__->_M_string_length);
  std::operator+(&local_50,"FLATBUFFERS_GENERATED_",__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  pbVar2 = (name_space->components).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__lhs = (name_space->components).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != pbVar2; __lhs = __lhs + 1) {
    std::operator+(&local_50,__lhs,"_");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (postfix->_M_string_length != 0) {
    std::operator+(&local_50,postfix,"_");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __first._M_current = (__return_storage_ptr__->_M_dataplus)._M_p;
  std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char(*)(char)>
            (__first,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(__first._M_current + __return_storage_ptr__->_M_string_length),__first,
             CharToUpper);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenIncludeGuard(const std::string &file_name,
                                   const Namespace &name_space,
                                   const std::string &postfix = "") {
  // Generate include guard.
  std::string guard = file_name;
  // Remove any non-alpha-numeric characters that may appear in a filename.
  struct IsAlnum {
    bool operator()(char c) const { return !is_alnum(c); }
  };
  guard.erase(std::remove_if(guard.begin(), guard.end(), IsAlnum()),
              guard.end());
  guard = "FLATBUFFERS_GENERATED_" + guard;
  guard += "_";
  // For further uniqueness, also add the namespace.
  for (const std::string &component : name_space.components) {
    guard += component + "_";
  }
  // Anything extra to add to the guard?
  if (!postfix.empty()) { guard += postfix + "_"; }
  guard += "H_";
  std::transform(guard.begin(), guard.end(), guard.begin(), CharToUpper);
  return guard;
}